

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O1

CURLcode pop3_statemach_act(connectdata *conn)

{
  curl_usessl cVar1;
  int *piVar2;
  _Bool _Var3;
  CURLcode CVar4;
  uint uVar5;
  curl_ftpfile cVar6;
  size_t sVar7;
  char *__dest;
  ulong uVar8;
  ulong maxlen;
  char *pcVar9;
  Curl_easy *pCVar10;
  byte *pbVar11;
  byte *pbVar12;
  long lVar13;
  pingpong *pp;
  curl_socket_t sockfd;
  bool bVar14;
  int pop3code;
  size_t nread;
  uint local_5c;
  pingpong *local_58;
  saslprogress local_50;
  undefined4 uStack_4c;
  curl_socket_t local_44;
  SASL *local_40;
  size_t local_38;
  
  sockfd = conn->sock[0];
  local_38 = 0;
  if ((conn->proto).imapc.state == IMAP_UPGRADETLS) {
    CVar4 = pop3_perform_upgrade_tls(conn);
    return CVar4;
  }
  pp = (pingpong *)&conn->proto;
  if ((conn->proto).ftpc.pp.sendleft != 0) {
    CVar4 = Curl_pp_flushsend(pp);
    return CVar4;
  }
  local_40 = (SASL *)&(conn->proto).imapc.sasl.prefmech;
  local_58 = pp;
  do {
    CVar4 = Curl_pp_readresp(sockfd,pp,(int *)&local_5c,&local_38);
    uVar5 = local_5c;
    if (CVar4 != CURLE_OK) {
      return CVar4;
    }
    if (local_5c == 0) {
      return CURLE_OK;
    }
    switch((conn->proto).imapc.state) {
    case IMAP_SERVERGREET:
      pCVar10 = conn->data;
      pcVar9 = (pCVar10->state).buffer;
      sVar7 = strlen(pcVar9);
      if (uVar5 == 0x2b) {
        if (((3 < sVar7) && (3 < sVar7 - 2)) && (pcVar9[sVar7 - 2] == '>')) {
          pcVar9 = pcVar9 + 3;
          do {
            if (*pcVar9 == '<') {
              if (sVar7 != 4) {
                __dest = (char *)(*Curl_ccalloc)(1,sVar7 - 3);
                (conn->proto).imapc.mailbox_uidvalidity = __dest;
                if (__dest != (char *)0x0) {
                  memcpy(__dest,pcVar9,sVar7 - 4);
                  (conn->proto).imapc.mailbox_uidvalidity[sVar7 - 4] = '\0';
                  pbVar11 = (byte *)((long)&conn->proto + 0xa8);
                  *pbVar11 = *pbVar11 | 2;
                }
              }
              break;
            }
            pcVar9 = pcVar9 + 1;
            sVar7 = sVar7 - 1;
          } while (sVar7 != 5);
        }
        pp = local_58;
        (conn->proto).ftpc.cwdcount = 0;
        (conn->proto).imapc.cmdid = 0;
        (conn->proto).pop3c.tls_supported = false;
        CVar4 = Curl_pp_sendf(local_58,"%s","CAPA");
        if (CVar4 == CURLE_OK) {
          (conn->proto).imapc.state = IMAP_CAPABILITY;
        }
      }
      else {
        Curl_failf(pCVar10,"Got unexpected pop3-server response");
        CVar4 = CURLE_WEIRD_SERVER_REPLY;
        pp = local_58;
      }
      break;
    case IMAP_CAPABILITY:
      pCVar10 = conn->data;
      piVar2 = (int *)(pCVar10->state).buffer;
      sVar7 = strlen((char *)piVar2);
      pp = local_58;
      if (uVar5 == 0x2b) {
        cVar1 = (pCVar10->set).use_ssl;
        if ((cVar1 != CURLUSESSL_NONE) && (conn->ssl[0].use == false)) {
          if ((conn->proto).pop3c.tls_supported == true) {
            CVar4 = Curl_pp_sendf(local_58,"%s","STLS");
            if (CVar4 == CURLE_OK) {
              (conn->proto).imapc.state = IMAP_STARTTLS;
            }
            break;
          }
          if (cVar1 != CURLUSESSL_TRY) {
            pcVar9 = "STLS not supported.";
            goto LAB_001349e5;
          }
        }
LAB_00134a4f:
        CVar4 = pop3_perform_authentication(conn);
      }
      else if (uVar5 == 0x2a) {
        if (sVar7 < 4) {
LAB_0013476d:
          CVar4 = CURLE_OK;
          if ((4 < sVar7) && ((char)piVar2[1] == ' ' && *piVar2 == 0x4c534153)) {
            pbVar11 = (byte *)((long)&conn->proto + 0xa8);
            *pbVar11 = *pbVar11 | 4;
            lVar13 = sVar7 - 5;
            pbVar11 = (byte *)((long)piVar2 + 5);
            local_44 = sockfd;
LAB_001347aa:
            bVar14 = lVar13 == 0;
            pbVar12 = pbVar11;
            if (!bVar14) {
              pbVar12 = pbVar11 + lVar13;
              lVar13 = -lVar13;
              bVar14 = false;
              do {
                if ((0x20 < (ulong)*pbVar11) ||
                   ((0x100002600U >> ((ulong)*pbVar11 & 0x3f) & 1) == 0)) {
                  uVar8 = 0;
                  goto LAB_001347fd;
                }
                pbVar11 = pbVar11 + 1;
                lVar13 = lVar13 + 1;
                bVar14 = lVar13 == 0;
              } while (!bVar14);
            }
            lVar13 = 0;
            goto LAB_001347ea;
          }
        }
        else {
          if (*piVar2 == 0x534c5453) {
            (conn->proto).pop3c.tls_supported = true;
          }
          else {
            if (*piVar2 != 0x52455355) goto LAB_0013476d;
            pbVar11 = (byte *)((long)&conn->proto + 0xa8);
            *pbVar11 = *pbVar11 | 1;
          }
          CVar4 = CURLE_OK;
        }
      }
      else {
        pbVar11 = (byte *)((long)&conn->proto + 0xa8);
        *pbVar11 = *pbVar11 | 1;
        CVar4 = pop3_perform_authentication(conn);
        pp = local_58;
      }
      break;
    case IMAP_STARTTLS:
      if (local_5c == 0x2b) {
        CVar4 = pop3_perform_upgrade_tls(conn);
      }
      else {
        pCVar10 = conn->data;
        if ((pCVar10->set).use_ssl == CURLUSESSL_TRY) goto LAB_00134a4f;
        pcVar9 = "STARTTLS denied";
LAB_001349e5:
        Curl_failf(pCVar10,pcVar9);
        CVar4 = CURLE_USE_SSL_FAILED;
      }
      break;
    case IMAP_AUTHENTICATE:
      pCVar10 = conn->data;
      CVar4 = Curl_sasl_continue(local_40,conn,local_5c,&local_50);
      if (CVar4 == CURLE_OK) {
        if (local_50 == SASL_IDLE) {
          cVar6 = (conn->proto).pop3c.preftype & (conn->proto).ftpc.prevmethod;
          if ((cVar6 & FTPFILE_NOCWD) == 0) {
            if ((cVar6 & FTPFILE_MULTICWD) == 0) {
              Curl_failf(pCVar10,"Authentication cancelled");
              CVar4 = CURLE_LOGIN_DENIED;
            }
            else {
              CVar4 = pop3_perform_user(conn);
            }
          }
          else {
            CVar4 = pop3_perform_apop(conn);
          }
        }
        else {
          CVar4 = CURLE_OK;
          if (local_50 == SASL_DONE) {
            (conn->proto).imapc.state = IMAP_STOP;
            CVar4 = CURLE_OK;
          }
        }
      }
      break;
    case IMAP_LOGIN:
      if (local_5c == 0x2b) goto switchD_00134684_caseD_4;
      pCVar10 = conn->data;
      pcVar9 = "Authentication failed: %d";
LAB_00134a1d:
      Curl_failf(pCVar10,pcVar9,(ulong)local_5c);
      CVar4 = CURLE_LOGIN_DENIED;
      break;
    case IMAP_LIST:
      if (local_5c == 0x2b) {
        pcVar9 = conn->passwd;
        if (pcVar9 == (char *)0x0) {
          pcVar9 = "";
        }
        CVar4 = Curl_pp_sendf(pp,"PASS %s",pcVar9);
      }
      else {
        Curl_failf(conn->data,"Access denied. %c",(ulong)local_5c);
        CVar4 = CURLE_LOGIN_DENIED;
      }
      if (CVar4 == CURLE_OK) {
        (conn->proto).imapc.state = IMAP_SELECT;
      }
      break;
    case IMAP_SELECT:
      if (local_5c != 0x2b) {
        pCVar10 = conn->data;
        pcVar9 = "Access denied. %c";
        goto LAB_00134a1d;
      }
    default:
switchD_00134684_caseD_4:
      (conn->proto).imapc.state = IMAP_STOP;
      CVar4 = CURLE_OK;
      break;
    case IMAP_FETCH:
      if (local_5c == 0x2b) {
        pCVar10 = conn->data;
        piVar2 = (int *)(pCVar10->req).protop;
        (conn->proto).pop3c.eob = 2;
        (conn->proto).pop3c.strip = 2;
        if (*piVar2 == 0) {
          Curl_setup_transfer(conn,0,-1,false,(curl_off_t *)0x0,-1,(curl_off_t *)0x0);
          pcVar9 = (conn->proto).ftpc.pp.cache;
          if (pcVar9 != (char *)0x0) {
            if (((pCVar10->set).opt_no_body == false) &&
               (CVar4 = Curl_pop3_write(conn,pcVar9,(conn->proto).rtspc.rtp_bufsize),
               CVar4 != CURLE_OK)) break;
            (*Curl_cfree)(pp->cache);
            pp->cache = (char *)0x0;
            pp->cache_size = 0;
          }
        }
        (conn->proto).imapc.state = IMAP_STOP;
        CVar4 = CURLE_OK;
      }
      else {
        (conn->proto).imapc.state = IMAP_STOP;
        CVar4 = CURLE_RECV_ERROR;
      }
    }
LAB_00134bc6:
    if (CVar4 != CURLE_OK) {
      return CVar4;
    }
    if ((conn->proto).imapc.state == IMAP_STOP) {
      return CURLE_OK;
    }
    _Var3 = Curl_pp_moredata(pp);
    if (!_Var3) {
      return CURLE_OK;
    }
  } while( true );
  while (uVar8 = uVar8 + 1, maxlen = -lVar13, uVar8 < (ulong)-lVar13) {
LAB_001347fd:
    if (((ulong)pbVar11[uVar8] < 0x21) &&
       (maxlen = uVar8, (0x100002600U >> ((ulong)pbVar11[uVar8] & 0x3f) & 1) != 0)) break;
  }
  uVar5 = Curl_sasl_decode_mech((char *)pbVar11,maxlen,(size_t *)&local_50);
  if ((uVar5 != 0) && (CONCAT44(uStack_4c,local_50) == maxlen)) {
    piVar2 = &(conn->proto).ftpc.cwdcount;
    *piVar2 = *piVar2 | uVar5;
  }
  pbVar12 = pbVar11 + maxlen;
  lVar13 = -(lVar13 + maxlen);
LAB_001347ea:
  pbVar11 = pbVar12;
  pp = local_58;
  sockfd = local_44;
  if (bVar14) goto LAB_00134bc6;
  goto LAB_001347aa;
}

Assistant:

static CURLcode pop3_statemach_act(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  curl_socket_t sock = conn->sock[FIRSTSOCKET];
  int pop3code;
  struct pop3_conn *pop3c = &conn->proto.pop3c;
  struct pingpong *pp = &pop3c->pp;
  size_t nread = 0;

  /* Busy upgrading the connection; right now all I/O is SSL/TLS, not POP3 */
  if(pop3c->state == POP3_UPGRADETLS)
    return pop3_perform_upgrade_tls(conn);

  /* Flush any data that needs to be sent */
  if(pp->sendleft)
    return Curl_pp_flushsend(pp);

 do {
    /* Read the response from the server */
    result = Curl_pp_readresp(sock, pp, &pop3code, &nread);
    if(result)
      return result;

    if(!pop3code)
      break;

    /* We have now received a full POP3 server response */
    switch(pop3c->state) {
    case POP3_SERVERGREET:
      result = pop3_state_servergreet_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_CAPA:
      result = pop3_state_capa_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_STARTTLS:
      result = pop3_state_starttls_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_AUTH:
      result = pop3_state_auth_resp(conn, pop3code, pop3c->state);
      break;

#ifndef CURL_DISABLE_CRYPTO_AUTH
    case POP3_APOP:
      result = pop3_state_apop_resp(conn, pop3code, pop3c->state);
      break;
#endif

    case POP3_USER:
      result = pop3_state_user_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_PASS:
      result = pop3_state_pass_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_COMMAND:
      result = pop3_state_command_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_QUIT:
      /* fallthrough, just stop! */
    default:
      /* internal error */
      state(conn, POP3_STOP);
      break;
    }
  } while(!result && pop3c->state != POP3_STOP && Curl_pp_moredata(pp));

  return result;
}